

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_get(Table *t,TValue *key)

{
  int iVar1;
  lua_Integer in_RAX;
  TValue *pTVar2;
  uint uVar3;
  Node *pNVar4;
  long lVar5;
  lua_Integer k;
  lua_Integer local_18;
  
  uVar3 = key->tt_ & 0x3f;
  if (uVar3 < 4) {
    if (uVar3 == 0) {
      return &luaO_nilobject_;
    }
    if ((uVar3 == 3) && (local_18 = in_RAX, iVar1 = luaV_tointeger(key,&local_18,0), iVar1 != 0)) {
      pTVar2 = luaH_getint(t,local_18);
      return pTVar2;
    }
  }
  else {
    if (uVar3 == 0x13) {
      pTVar2 = luaH_getint(t,(key->value_).i);
      return pTVar2;
    }
    if (uVar3 == 4) {
      pNVar4 = t->node + (~(-1 << (t->lsizenode & 0x1f)) &
                         *(uint *)&((GCObject *)(key->value_).f)->field_0xc);
      while (((pNVar4->i_key).nk.tt_ != 0x44 ||
             ((pNVar4->i_key).nk.value_.gc != (GCObject *)(key->value_).f))) {
        lVar5 = (long)(pNVar4->i_key).nk.next;
        pNVar4 = pNVar4 + lVar5;
        if (lVar5 == 0) {
          return &luaO_nilobject_;
        }
      }
      return &pNVar4->i_val;
    }
  }
  pTVar2 = getgeneric(t,key);
  return pTVar2;
}

Assistant:

const TValue *luaH_get (Table *t, const TValue *key) {
  switch (ttypetag(key)) {
    case LUA_VSHRSTR: return luaH_getshortstr(t, tsvalue(key));
    case LUA_VNUMINT: return luaH_getint(t, ivalue(key));
    case LUA_VNIL: return &absentkey;
    case LUA_VNUMFLT: {
      lua_Integer k;
      if (luaV_flttointeger(fltvalue(key), &k, F2Ieq)) /* integral index? */
        return luaH_getint(t, k);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      return getgeneric(t, key);
  }
}